

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChVector<double> *
chrono::Q_to_Euler123(ChVector<double> *__return_storage_ptr__,ChQuaternion<double> *mq)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 extraout_var [56];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  dVar8 = mq->m_data[0];
  dVar1 = mq->m_data[1];
  dVar2 = mq->m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2;
  dVar3 = mq->m_data[3];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar8 * dVar1;
  auVar6 = vfmadd231sd_fma(auVar9,auVar15,auVar16);
  dVar7 = atan2(auVar6._0_8_ + auVar6._0_8_,
                dVar8 * dVar8 + ((dVar3 * dVar3 - dVar2 * dVar2) - dVar1 * dVar1));
  __return_storage_ptr__->m_data[0] = dVar7;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = mq->m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = mq->m_data[3];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = mq->m_data[2] * mq->m_data[0];
  auVar6 = vfmsub231sd_fma(auVar13,auVar10,auVar6);
  auVar12._0_8_ = asin(auVar6._0_8_ + auVar6._0_8_);
  auVar12._8_56_ = extraout_var;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar12._0_16_,auVar5);
  dVar7 = (double)vmovlpd_avx(auVar6);
  __return_storage_ptr__->m_data[1] = dVar7;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = mq->m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = mq->m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = mq->m_data[3] * mq->m_data[0];
  auVar6 = vfmadd231sd_fma(auVar14,auVar11,auVar4);
  dVar8 = atan2(auVar6._0_8_ + auVar6._0_8_,
                ((dVar8 * dVar8 + dVar1 * dVar1) - dVar3 * dVar3) - dVar2 * dVar2);
  __return_storage_ptr__->m_data[2] = dVar8;
  return __return_storage_ptr__;
}

Assistant:

ChVector<double> Q_to_Euler123(const ChQuaternion<double>& mq) {
	ChVector<double> euler;
    double sq0 = mq.e0() * mq.e0();
    double sq1 = mq.e1() * mq.e1();
    double sq2 = mq.e2() * mq.e2();
    double sq3 = mq.e3() * mq.e3();
    // roll
    euler.x() = atan2(2 * (mq.e2() * mq.e3() + mq.e0() * mq.e1()), sq3 - sq2 - sq1 + sq0);
    // pitch
    euler.y() = -asin(2 * (mq.e1() * mq.e3() - mq.e0() * mq.e2()));
    // yaw
    euler.z() = atan2(2 * (mq.e1() * mq.e2() + mq.e3() * mq.e0()), sq1 + sq0 - sq3 - sq2);
	
	return euler;
}